

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_manager.cpp
# Opt level: O3

void __thiscall
spvtools::opt::analysis::TypeManager::TypeManager
          (TypeManager *this,MessageConsumer *consumer,IRContext *c)

{
  this->consumer_ = consumer;
  this->context_ = c;
  (this->id_to_type_)._M_h._M_buckets = &(this->id_to_type_)._M_h._M_single_bucket;
  (this->id_to_type_)._M_h._M_bucket_count = 1;
  (this->id_to_type_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->id_to_type_)._M_h._M_element_count = 0;
  (this->id_to_type_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->id_to_type_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->id_to_type_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->type_to_id_)._M_h._M_buckets = &(this->type_to_id_)._M_h._M_single_bucket;
  (this->type_to_id_)._M_h._M_bucket_count = 1;
  (this->type_to_id_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->type_to_id_)._M_h._M_element_count = 0;
  (this->type_to_id_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->type_to_id_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->type_to_id_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->type_pool_)._M_h._M_buckets = &(this->type_pool_)._M_h._M_single_bucket;
  (this->type_pool_)._M_h._M_bucket_count = 1;
  (this->type_pool_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->type_pool_)._M_h._M_element_count = 0;
  (this->type_pool_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->type_pool_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->type_pool_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->incomplete_types_).
  super__Vector_base<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->incomplete_types_).
  super__Vector_base<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->incomplete_types_).
  super__Vector_base<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->id_to_incomplete_type_)._M_h._M_buckets =
       &(this->id_to_incomplete_type_)._M_h._M_single_bucket;
  (this->id_to_incomplete_type_)._M_h._M_bucket_count = 1;
  (this->id_to_incomplete_type_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->id_to_incomplete_type_)._M_h._M_element_count = 0;
  (this->id_to_incomplete_type_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->id_to_incomplete_type_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->id_to_incomplete_type_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->id_to_constant_inst_)._M_h._M_buckets = &(this->id_to_constant_inst_)._M_h._M_single_bucket
  ;
  (this->id_to_constant_inst_)._M_h._M_bucket_count = 1;
  (this->id_to_constant_inst_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->id_to_constant_inst_)._M_h._M_element_count = 0;
  (this->id_to_constant_inst_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->id_to_constant_inst_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->id_to_constant_inst_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  AnalyzeTypes(this,(c->module_)._M_t.
                    super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                    .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
  return;
}

Assistant:

TypeManager::TypeManager(const MessageConsumer& consumer, IRContext* c)
    : consumer_(consumer), context_(c) {
  AnalyzeTypes(*c->module());
}